

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_pss.cc
# Opt level: O0

EVP_MD * rsa_algor_to_md(X509_ALGOR *alg)

{
  int iVar1;
  EVP_MD *md;
  X509_ALGOR *alg_local;
  
  if (alg == (X509_ALGOR *)0x0) {
    ERR_put_error(0xb,0,0x70,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/rsa_pss.cc"
                  ,0x80);
    alg_local = (X509_ALGOR *)0x0;
  }
  else {
    alg_local = (X509_ALGOR *)EVP_get_digestbyobj(alg->algorithm);
    if (((EVP_MD *)alg_local == (EVP_MD *)0x0) ||
       (iVar1 = is_allowed_pss_md((EVP_MD *)alg_local), iVar1 == 0)) {
      ERR_put_error(0xb,0,0x70,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/rsa_pss.cc"
                    ,0x85);
      alg_local = (X509_ALGOR *)0x0;
    }
  }
  return (EVP_MD *)alg_local;
}

Assistant:

static const EVP_MD *rsa_algor_to_md(const X509_ALGOR *alg) {
  if (!alg) {
    // If omitted, PSS defaults to SHA-1, which we do not allow.
    OPENSSL_PUT_ERROR(X509, X509_R_INVALID_PSS_PARAMETERS);
    return NULL;
  }
  const EVP_MD *md = EVP_get_digestbyobj(alg->algorithm);
  if (md == NULL || !is_allowed_pss_md(md)) {
    OPENSSL_PUT_ERROR(X509, X509_R_INVALID_PSS_PARAMETERS);
    return NULL;
  }
  return md;
}